

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_domain_logs.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ee46::Json2Array<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType>::
Json2Array(Json2Array<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType> *this,Value *value,
          vector<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType,_std::allocator<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_b0 [8];
  CdnDescribeCdnDomainLogsDomainLogDetailType val;
  int i;
  vector<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType,_std::allocator<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.end_time.field_2._12_4_ = 0; uVar1 = val.end_time.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.end_time.field_2._12_4_ = val.end_time.field_2._12_4_ + 1) {
      aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType::
      CdnDescribeCdnDomainLogsDomainLogDetailType
                ((CdnDescribeCdnDomainLogsDomainLogDetailType *)local_b0);
      value_00 = Json::Value::operator[](value,val.end_time.field_2._12_4_);
      anon_unknown.dwarf_1ee46::Json2Type
                (value_00,(CdnDescribeCdnDomainLogsDomainLogDetailType *)local_b0);
      std::
      vector<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType,_std::allocator<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType>_>
      ::push_back(vec,(value_type *)local_b0);
      aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType::
      ~CdnDescribeCdnDomainLogsDomainLogDetailType
                ((CdnDescribeCdnDomainLogsDomainLogDetailType *)local_b0);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }